

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O3

RealType __thiscall OpenMD::Snapshot::getVolume(Snapshot *this)

{
  RealType RVar1;
  
  if (this->hasVolume == true) {
    RVar1 = (this->frameData).volume;
  }
  else {
    RVar1 = SquareMatrix3<double>::determinant(&(this->frameData).hmat);
    (this->frameData).volume = RVar1;
    this->hasVolume = true;
  }
  return RVar1;
}

Assistant:

RealType Snapshot::getVolume() {
    if (!hasVolume) {
      frameData.volume = frameData.hmat.determinant();
      hasVolume        = true;
    }
    return frameData.volume;
  }